

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_window_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::BaseSelectBinder::BindWindow
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,WindowExpression *window,
          idx_t depth)

{
  string *catalog;
  string *schema;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *expr;
  vector<duckdb::OrderByNode,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  ExpressionType EVar4;
  bool bVar5;
  WindowBoundary WVar6;
  WindowExcludeMode WVar7;
  pointer pcVar8;
  pointer puVar9;
  ClientContext *pCVar10;
  pointer pOVar11;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var14;
  BoundSelectNode *pBVar15;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> uVar16;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> uVar17;
  char *pcVar18;
  BaseScalarFunction *pBVar19;
  _func_int ***ppp_Var20;
  FunctionNullHandling FVar21;
  FunctionErrors FVar22;
  FunctionCollationHandling FVar23;
  AggregateDistinctDependent AVar24;
  optional_ptr<duckdb::Binder,_true> oVar25;
  optional_ptr<duckdb::CatalogEntry,_true> oVar26;
  undefined8 uVar27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  _Alloc_hider _Var29;
  size_type sVar30;
  element_type *peVar31;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_01
  ;
  OrderType OVar32;
  uint uVar33;
  type pFVar34;
  BinderException *pBVar35;
  type pPVar36;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar37;
  pointer pEVar38;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> this_01;
  CollationBinding *pCVar39;
  idx_t offset;
  const_reference other;
  pointer pBVar40;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> this_02;
  pointer pBVar41;
  DBConfig *this_03;
  reference pvVar42;
  InternalException *pIVar43;
  LogicalTypeId LVar44;
  long lVar45;
  ExpressionType type;
  ExpressionType type_00;
  ExpressionType type_01;
  string *name_p;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  shared_ptr<duckdb::ExtraValueInfo,_true> *this_04;
  pointer puVar46;
  aggregate_size_t *pp_Var47;
  undefined8 *puVar48;
  aggregate_size_t *pp_Var49;
  OrderByNode *order_1;
  pointer pOVar50;
  unsigned_long params_1;
  OrderByNode *order;
  pointer pLVar51;
  char *pcVar52;
  byte bVar53;
  optional_idx best_function;
  idx_t depth_local;
  OrderByNullType null_order;
  undefined7 uStack_5af;
  FunctionBinder function_binder;
  _Alloc_hider _Stack_598;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  undefined1 local_588 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_578;
  undefined4 local_568;
  undefined4 uStack_564;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_558;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_540;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> local_538;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_530;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_528;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_520;
  BindResult *local_518;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_510;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_508;
  long *local_500;
  vector<duckdb::LogicalType,_true> types;
  AggregateFunction bound_function;
  ErrorData error_aggr;
  LogicalType local_308;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_2f0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_2e8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_2e0;
  string name;
  ErrorData error;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_238;
  undefined1 local_218 [128];
  BaseScalarFunction local_198;
  undefined8 auStack_e8 [14];
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  LogicalType local_68;
  EntryLookupInfo function_lookup;
  
  bVar53 = 0;
  local_520._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (window->super_ParsedExpression).super_BaseExpression.query_location.index;
  name_p = &window->function_name;
  depth_local = depth;
  local_518 = __return_storage_ptr__;
  EntryLookupInfo::EntryLookupInfo
            (&function_lookup,SCALAR_FUNCTION_ENTRY,name_p,(QueryErrorContext)local_520._M_pi);
  catalog = &window->catalog;
  schema = &window->schema;
  entry = Binder::GetCatalogEntry
                    ((this->super_ExpressionBinder).binder,catalog,schema,&function_lookup,
                     RETURN_NULL);
  if ((entry.ptr != (CatalogEntry *)0x0 &&
       (window->super_ParsedExpression).super_BaseExpression.type == WINDOW_AGGREGATE) &&
     (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry), (entry.ptr)->type == MACRO_ENTRY
     )) {
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,decltype(nullptr),bool&>
              ((duckdb *)&bound_function,catalog,schema,name_p,&window->children,
               &window->filter_expr,(void **)&error,&window->distinct);
    (*(window->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (&error,window);
    pFVar34 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                           *)&bound_function);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry);
    (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[0xc])
              (local_518,this,pFVar34,entry.ptr,depth_local,&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        == (_func_int **)0x0) {
      return local_518;
    }
    (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function + 8))();
    return local_518;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  pcVar8 = (window->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&name,pcVar8,
             pcVar8 + (window->super_ParsedExpression).super_BaseExpression.alias._M_string_length);
  if (this->inside_window == true) {
    pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)
         &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
          _M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,"window function calls cannot be nested","");
    BinderException::BinderException<>
              (pBVar35,(QueryErrorContext)local_520._M_pi,(string *)&bound_function);
    __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (depth_local != 0) {
    pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)
         &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
          _M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,"correlated columns in window functions not supported","");
    BinderException::BinderException<>
              (pBVar35,(QueryErrorContext)local_520._M_pi,(string *)&bound_function);
    __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((byte)(window->start - EXPR_PRECEDING_RANGE) < 2) ||
     ((byte)(window->end - EXPR_PRECEDING_RANGE) < 2)) {
    local_568 = (int)CONCAT71((int7)((ulong)window >> 8),1);
    if ((long)(window->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(window->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) {
      pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&bound_function,"RANGE frames must have only one ORDER BY expression","")
      ;
      BinderException::BinderException<>
                (pBVar35,(QueryErrorContext)local_520._M_pi,(string *)&bound_function);
      __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    _local_568 = (ulong)(uint)uStack_564 << 0x20;
  }
  this->inside_window = true;
  ErrorData::ErrorData(&error);
  puVar46 = (window->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (window->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar46 != puVar9) {
    do {
      ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar46,depth_local,&error);
      puVar46 = puVar46 + 1;
    } while (puVar46 != puVar9);
  }
  puVar46 = (window->partitions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar46 != puVar9) {
    do {
      ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar46,depth_local,&error);
      puVar46 = puVar46 + 1;
    } while (puVar46 != puVar9);
  }
  pLVar51 = (pointer)(window->orders).
                     super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  local_560._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pLVar51 != (pointer)local_560._M_pi) {
    do {
      expr = &pLVar51->type_info_;
      ExpressionBinder::BindChild
                (&this->super_ExpressionBinder,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)expr,depth_local,&error);
      if (((undefined1)local_568 != '\0') && (error.initialized == false)) {
        pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)expr);
        puVar37 = BoundExpression::GetExpression(pPVar36);
        pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar37);
        LVar44 = (pEVar38->return_type).id_;
        if ((LVar44 == TIME_TZ) || (LVar44 == TIME)) {
          Value::DATE((Value *)&error_aggr,(date_t)0x0);
          this_01._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
               operator_new(0x78);
          Value::Value((Value *)&bound_function,(Value *)&error_aggr);
          ConstantExpression::ConstantExpression
                    ((ConstantExpression *)
                     this_01._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                     (Value *)&bound_function);
          Value::~Value((Value *)&bound_function);
          local_588._0_8_ =
               this_01._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          Value::~Value((Value *)&error_aggr);
          ExpressionBinder::BindChild
                    (&this->super_ExpressionBinder,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_588,depth_local,&error);
          pCVar10 = (this->super_ExpressionBinder).context;
          bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
               = (_func_int **)
                 &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                  _M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&bound_function,"+","");
          BindRangeExpression(&local_68,pCVar10,(string *)&bound_function,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)expr,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                       *)local_588);
          LogicalType::~LogicalType(&local_68);
          if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
              _vptr_Function !=
              (_func_int **)
              &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_string_length) {
            operator_delete(bound_function.super_BaseScalarFunction.super_SimpleFunction.
                            super_Function._vptr_Function);
          }
          if ((ParsedExpression *)local_588._0_8_ != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_588._0_8_ + 8))();
          }
        }
      }
      pLVar51 = (pointer)&(pLVar51->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
    } while (pLVar51 != (pointer)local_560._M_pi);
  }
  local_2e0 = &window->filter_expr;
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,local_2e0,depth_local,&error);
  _local_568 = &window->start_expr;
  ExpressionBinder::BindChild
            (&this->super_ExpressionBinder,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)_local_568,depth_local,&error);
  local_560._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&window->end_expr;
  ExpressionBinder::BindChild
            (&this->super_ExpressionBinder,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)local_560._M_pi,depth_local,&error);
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,&window->offset_expr,depth_local,&error)
  ;
  ExpressionBinder::BindChild
            (&this->super_ExpressionBinder,&window->default_expr,depth_local,&error);
  pOVar50 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar11 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pOVar50 != pOVar11) {
    do {
      ExpressionBinder::BindChild
                (&this->super_ExpressionBinder,&pOVar50->expression,depth_local,&error);
      pOVar50 = pOVar50 + 1;
    } while (pOVar50 != pOVar11);
  }
  this->inside_window = false;
  if (error.initialized != false) {
    paVar1 = &error.raw_message.field_2;
    local_218[0] = error.initialized;
    local_218[1] = error.type;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.raw_message._M_dataplus._M_p == paVar1) {
      local_218._32_4_ = error.raw_message.field_2._8_4_;
      local_218._36_4_ = error.raw_message.field_2._12_4_;
      local_218._8_8_ = local_218 + 0x18;
    }
    else {
      local_218._8_8_ = error.raw_message._M_dataplus._M_p;
    }
    paVar2 = &error.final_message.field_2;
    local_218._16_8_ = error.raw_message._M_string_length;
    error.raw_message._M_string_length = 0;
    error.raw_message.field_2._M_allocated_capacity._0_4_ =
         error.raw_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.final_message._M_dataplus._M_p == paVar2) {
      local_218._64_4_ = error.final_message.field_2._8_4_;
      local_218._68_4_ = error.final_message.field_2._12_4_;
      local_218._40_8_ = local_218 + 0x38;
    }
    else {
      local_218._40_8_ = error.final_message._M_dataplus._M_p;
    }
    local_218._48_8_ = error.final_message._M_string_length;
    error.final_message._M_string_length = 0;
    error.final_message.field_2._M_allocated_capacity._0_4_ =
         error.final_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    error.raw_message._M_dataplus._M_p = (pointer)paVar1;
    error.final_message._M_dataplus._M_p = (pointer)paVar2;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_218 + 0x48),&error.extra_info);
    BindResult::BindResult(local_518,(ErrorData *)local_218);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_218 + 0x48));
    if ((undefined1 *)local_218._40_8_ != local_218 + 0x38) {
      operator_delete((void *)local_218._40_8_);
    }
    if ((undefined1 *)local_218._8_8_ != local_218 + 0x18) {
      operator_delete((void *)local_218._8_8_);
    }
    goto LAB_00d850ff;
  }
  pOVar11 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_2f0 = &window->offset_expr;
  local_2e8 = &window->default_expr;
  for (pOVar50 = (window->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar50 != pOVar11; pOVar50 = pOVar50 + 1
      ) {
    pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar50->expression);
    puVar37 = BoundExpression::GetExpression(pPVar36);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar37);
    pCVar39 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar39,pCVar10,puVar37,&pEVar38->return_type,ALL_COLLATIONS);
  }
  puVar9 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar46 = (window->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar46 != puVar9; puVar46 = puVar46 + 1
      ) {
    pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar46);
    puVar37 = BoundExpression::GetExpression(pPVar36);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar37);
    pCVar39 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar39,pCVar10,puVar37,&pEVar38->return_type,ALL_COLLATIONS);
  }
  pOVar11 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pOVar50 = (window->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar50 != pOVar11; pOVar50 = pOVar50 + 1
      ) {
    pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar50->expression);
    puVar37 = BoundExpression::GetExpression(pPVar36);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar37);
    pCVar39 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar39,pCVar10,puVar37,&pEVar38->return_type,ALL_COLLATIONS);
  }
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar46 = (window->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (window->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar46 != puVar9) {
    do {
      pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar46);
      puVar37 = BoundExpression::GetExpression(pPVar36);
      EVar4 = (window->super_ParsedExpression).super_BaseExpression.type;
      if (EVar4 == WINDOW_NTILE) {
        if (local_558.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_558.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pCVar10 = (this->super_ExpressionBinder).context;
          local_528._M_head_impl =
               (puVar37->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
          BoundCastExpression::AddCastToType
                    ((BoundCastExpression *)&error_aggr,pCVar10,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_528,(LogicalType *)&bound_function,false);
          uVar27 = error_aggr._0_8_;
          error_aggr.initialized = false;
          error_aggr.type = INVALID;
          error_aggr._2_6_ = 0;
          _Var12._M_head_impl =
               (puVar37->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar27;
          if (_Var12._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
          }
          if (error_aggr._0_8_ != 0) {
            (**(code **)(*(long *)error_aggr._0_8_ + 8))();
          }
          error_aggr.initialized = false;
          error_aggr.type = INVALID;
          error_aggr._2_6_ = 0;
          LogicalType::~LogicalType((LogicalType *)&bound_function);
          if (local_528._M_head_impl != (Expression *)0x0) {
            (*((local_528._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_528._M_head_impl = (Expression *)0x0;
        }
      }
      else if ((EVar4 == WINDOW_NTH_VALUE) &&
              ((long)local_558.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_558.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 8)) {
        pCVar10 = (this->super_ExpressionBinder).context;
        local_530._M_head_impl =
             (puVar37->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&error_aggr,pCVar10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_530,(LogicalType *)&bound_function,false);
        uVar27 = error_aggr._0_8_;
        error_aggr.initialized = false;
        error_aggr.type = INVALID;
        error_aggr._2_6_ = 0;
        _Var12._M_head_impl =
             (puVar37->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar27;
        if (_Var12._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
        }
        if (error_aggr._0_8_ != 0) {
          (**(code **)(*(long *)error_aggr._0_8_ + 8))();
        }
        error_aggr.initialized = false;
        error_aggr.type = INVALID;
        error_aggr._2_6_ = 0;
        LogicalType::~LogicalType((LogicalType *)&bound_function);
        if (local_530._M_head_impl != (Expression *)0x0) {
          (*((local_530._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_530._M_head_impl = (Expression *)0x0;
      }
      pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar37);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&types,
                 &pEVar38->return_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_558,puVar37);
      puVar46 = puVar46 + 1;
    } while (puVar46 != puVar9);
  }
  LogicalType::LogicalType(&local_308);
  local_538._M_head_impl = (AggregateFunction *)0x0;
  local_540._M_head_impl = (FunctionData *)0x0;
  EVar4 = (window->super_ParsedExpression).super_BaseExpression.type;
  if (EVar4 == 0x6e) {
    if ((entry.ptr == (CatalogEntry *)0x0) ||
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry),
       (entry.ptr)->type != AGGREGATE_FUNCTION_ENTRY)) {
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                     ((this->super_ExpressionBinder).context,catalog,schema,name_p,THROW_EXCEPTION,
                      (QueryErrorContext)local_520._M_pi);
      optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> *)&bound_function);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry);
    oVar26 = entry;
    ErrorData::ErrorData(&error_aggr);
    FunctionBinder::FunctionBinder(&function_binder,(this->super_ExpressionBinder).context);
    this_04 = &oVar26.ptr[1].comment.value_info_;
    best_function =
         FunctionBinder::BindFunction
                   (&function_binder,&(oVar26.ptr)->name,(AggregateFunctionSet *)this_04,&types,
                    &error_aggr);
    if (best_function.index == 0xffffffffffffffff) {
      ErrorData::AddQueryLocation(&error_aggr,&window->super_ParsedExpression);
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&bound_function,anon_var_dwarf_4f18422 + 9);
      ErrorData::Throw(&error_aggr,(string *)&bound_function);
    }
    offset = optional_idx::GetIndex(&best_function);
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              (&bound_function,(FunctionSet<duckdb::AggregateFunction> *)this_04,offset);
    SimpleFunction::SimpleFunction
              (&local_198.super_SimpleFunction,(SimpleFunction *)&bound_function);
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_02446ee0;
    LogicalType::LogicalType
              (&local_198.return_type,&bound_function.super_BaseScalarFunction.return_type);
    local_198.stability = bound_function.super_BaseScalarFunction.stability;
    local_198.null_handling = bound_function.super_BaseScalarFunction.null_handling;
    local_198.errors = bound_function.super_BaseScalarFunction.errors;
    local_198.collation_handling = bound_function.super_BaseScalarFunction.collation_handling;
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243ae10;
    pp_Var47 = &bound_function.state_size;
    puVar48 = auStack_e8;
    for (lVar45 = 0xd; lVar45 != 0; lVar45 = lVar45 + -1) {
      *puVar48 = *pp_Var47;
      pp_Var47 = pp_Var47 + (ulong)bVar53 * -2 + 1;
      puVar48 = puVar48 + (ulong)bVar53 * -2 + 1;
    }
    auStack_e8[0xd]._0_1_ = bound_function.order_dependent;
    auStack_e8[0xd]._1_1_ = bound_function.distinct_dependent;
    local_78 = bound_function.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70 = bound_function.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (bound_function.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (bound_function.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (bound_function.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (bound_function.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (bound_function.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_500 = (long *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)&null_order,(AggregateFunction *)&function_binder,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_198,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_238,0);
    if (local_500 != (long *)0x0) {
      (**(code **)(*local_500 + 8))();
    }
    local_500 = (long *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_238);
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243ae10;
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_198);
    pBVar40 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&null_order);
    this_02._M_head_impl = (AggregateFunction *)operator_new(0x130);
    SimpleFunction::SimpleFunction
              ((SimpleFunction *)this_02._M_head_impl,(SimpleFunction *)&pBVar40->function);
    ((this_02._M_head_impl)->super_BaseScalarFunction).super_SimpleFunction.super_Function.
    _vptr_Function = (_func_int **)&PTR__BaseScalarFunction_02446ee0;
    LogicalType::LogicalType
              (&((this_02._M_head_impl)->super_BaseScalarFunction).return_type,
               &(pBVar40->function).super_BaseScalarFunction.return_type);
    FVar21 = (pBVar40->function).super_BaseScalarFunction.null_handling;
    FVar22 = (pBVar40->function).super_BaseScalarFunction.errors;
    FVar23 = (pBVar40->function).super_BaseScalarFunction.collation_handling;
    ((this_02._M_head_impl)->super_BaseScalarFunction).stability =
         (pBVar40->function).super_BaseScalarFunction.stability;
    ((this_02._M_head_impl)->super_BaseScalarFunction).null_handling = FVar21;
    ((this_02._M_head_impl)->super_BaseScalarFunction).errors = FVar22;
    ((this_02._M_head_impl)->super_BaseScalarFunction).collation_handling = FVar23;
    ((this_02._M_head_impl)->super_BaseScalarFunction).super_SimpleFunction.super_Function.
    _vptr_Function = (_func_int **)&PTR__AggregateFunction_0243ae10;
    pp_Var47 = &(pBVar40->function).state_size;
    pp_Var49 = &(this_02._M_head_impl)->state_size;
    for (lVar45 = 0xd; lVar45 != 0; lVar45 = lVar45 + -1) {
      *pp_Var49 = *pp_Var47;
      pp_Var47 = pp_Var47 + (ulong)bVar53 * -2 + 1;
      pp_Var49 = pp_Var49 + (ulong)bVar53 * -2 + 1;
    }
    AVar24 = (pBVar40->function).distinct_dependent;
    (this_02._M_head_impl)->order_dependent = (pBVar40->function).order_dependent;
    (this_02._M_head_impl)->distinct_dependent = AVar24;
    ((this_02._M_head_impl)->function_info).internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pBVar40->function).function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = (pBVar40->function).function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    ((this_02._M_head_impl)->function_info).internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var13;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
    if (local_538._M_head_impl != (AggregateFunction *)0x0) {
      pBVar19 = &(local_538._M_head_impl)->super_BaseScalarFunction;
      local_538._M_head_impl = this_02._M_head_impl;
      (*(pBVar19->super_SimpleFunction).super_Function._vptr_Function[1])();
      this_02._M_head_impl = local_538._M_head_impl;
    }
    local_538._M_head_impl = this_02._M_head_impl;
    pBVar40 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&null_order);
    _Var14._M_head_impl =
         (pBVar40->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (pBVar40->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
    if ((pointer)local_540._M_head_impl != (pointer)0x0) {
      ppp_Var20 = &(local_540._M_head_impl)->_vptr_FunctionData;
      local_540._M_head_impl = _Var14._M_head_impl;
      (*(*ppp_Var20)[1])();
      _Var14._M_head_impl = local_540._M_head_impl;
    }
    local_540._M_head_impl = _Var14._M_head_impl;
    pBVar40 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&null_order);
    uVar16._M_t.
    super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
    super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
          )(pBVar40->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    uVar17._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         (pBVar40->children).
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pLVar51 = (pointer)(pBVar40->children).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_588._0_8_ =
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_588._8_8_ =
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_578._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_558.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pBVar40->children).
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar40->children).
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar40->children).
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)uVar16._M_t.
                  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)uVar17._M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    local_558.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pLVar51;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_588);
    pBVar40 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&null_order);
    if (&local_308 != &(pBVar40->super_Expression).return_type) {
      local_308.id_ = (pBVar40->super_Expression).return_type.id_;
      local_308.physical_type_ = (pBVar40->super_Expression).return_type.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_308.type_info_,&(pBVar40->super_Expression).return_type.type_info_);
    }
    if ((long *)CONCAT71(uStack_5af,null_order) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_5af,null_order) + 8))();
    }
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243ae10;
    if (bound_function.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (bound_function.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction(&bound_function.super_BaseScalarFunction);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&error_aggr.extra_info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_aggr.final_message._M_dataplus._M_p != &error_aggr.final_message.field_2) {
      operator_delete(error_aggr.final_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_aggr.raw_message._M_dataplus._M_p != &error_aggr.raw_message.field_2) {
      operator_delete(error_aggr.raw_message._M_dataplus._M_p);
    }
  }
  else {
    uVar33 = EVar4 - 0x78;
    if (0xe < uVar33) {
LAB_00d85336:
      pIVar43 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bound_function,"Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &error_aggr);
      InternalException::InternalException(pIVar43,(string *)&bound_function);
      __cxa_throw(pIVar43,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar52 = "s";
    if ((0x3bU >> (uVar33 & 0x1f) & 1) == 0) {
      if ((0x3c04U >> (uVar33 & 0x1f) & 1) == 0) {
        if (uVar33 != 0xe) goto LAB_00d85336;
        params_1 = 2;
      }
      else {
        params_1 = 1;
        pcVar52 = anon_var_dwarf_4f18422 + 9;
      }
    }
    else {
      params_1 = 0;
    }
    if (((long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - params_1 != 0) {
      pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&bound_function,"%s needs %d parameter%s, got %d","");
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type);
      BinderException::BinderException<std::__cxx11::string,unsigned_long,char_const*,unsigned_long>
                (pBVar35,(string *)&bound_function,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_aggr,
                 params_1,pcVar52,
                 ((long)types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0xe < uVar33) {
LAB_00d8539b:
      pIVar43 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type_01);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bound_function,"Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &error_aggr);
      InternalException::InternalException(pIVar43,(string *)&bound_function);
      __cxa_throw(pIVar43,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((0x7c00U >> (uVar33 & 0x1f) & 1) == 0) {
      if ((0x27U >> (uVar33 & 0x1f) & 1) == 0) {
        LVar44 = DOUBLE;
        if ((0x18U >> (uVar33 & 0x1f) & 1) == 0) goto LAB_00d8539b;
      }
      else {
        LVar44 = BIGINT;
      }
      LogicalType::LogicalType((LogicalType *)local_588,LVar44);
    }
    else {
      other = vector<duckdb::LogicalType,_true>::operator[](&types,0);
      LogicalType::LogicalType((LogicalType *)local_588,other);
    }
    _Var28._M_pi = local_308.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
    peVar31 = local_308.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar27 = local_588._0_8_;
    local_308.id_ = local_588[0];
    local_308.physical_type_ = local_588[1];
    local_308.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_588._8_8_;
    local_308.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_578._M_pi;
    local_588._8_8_ = peVar31;
    local_578._M_pi = _Var28._M_pi;
    local_588._0_8_ = uVar27;
    LogicalType::~LogicalType((LogicalType *)local_588);
  }
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       CONCAT71(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function._1_7_,(window->super_ParsedExpression).super_BaseExpression.type);
  make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::AggregateFunction,std::default_delete<duckdb::AggregateFunction>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&best_function,(ExpressionType *)&bound_function,&local_308,
             (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
              *)&local_538,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_540);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length
       = (size_type)
         (pBVar41->children).
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar41->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_558.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       (pBVar41->children).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p
       = (pointer)(pBVar41->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  (pBVar41->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_558.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pBVar41->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_558.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&bound_function);
  puVar46 = (window->partitions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar46 != puVar9) {
    do {
      pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&best_function);
      GetExpression((duckdb *)&bound_function,puVar46);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar41->partitions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &bound_function);
      if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
          != (_func_int **)0x0) {
        (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      puVar46 = puVar46 + 1;
    } while (puVar46 != puVar9);
  }
  bVar5 = window->ignore_nulls;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar41->ignore_nulls = bVar5;
  bVar5 = window->distinct;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar41->distinct = bVar5;
  this_03 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
  LogicalType::LogicalType((LogicalType *)&error_aggr,BIGINT);
  this_00 = &window->orders;
  if (window->start == EXPR_FOLLOWING_RANGE) {
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar32 = DBConfig::ResolveOrder(this_03,pvVar42->type);
    pcVar52 = "U\x04-";
    if (OVar32 == ASCENDING) {
      pcVar52 = "U\x04+";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    psVar3 = &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_string_length;
    pcVar18 = "U\x04-";
    if (OVar32 == ASCENDING) {
      pcVar18 = "U\x04+";
    }
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)psVar3;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,pcVar52 + 2,pcVar18 + 3);
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)local_588,pCVar10,(string *)&bound_function,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)_local_568,&pvVar42->expression);
    sVar30 = error_aggr.raw_message._M_string_length;
    _Var29 = error_aggr.raw_message._M_dataplus;
    uVar27 = local_588._0_8_;
    error_aggr.initialized = (bool)local_588[0];
    error_aggr.type = local_588[1];
    error_aggr.raw_message._M_dataplus._M_p = (pointer)local_588._8_8_;
    error_aggr.raw_message._M_string_length = (size_type)local_578._M_pi;
    local_588._8_8_ = _Var29._M_p;
    local_578._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar30;
    local_588._0_8_ = uVar27;
    LogicalType::~LogicalType((LogicalType *)local_588);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)psVar3) {
LAB_00d848f5:
      operator_delete(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function);
    }
  }
  else if (window->start == EXPR_PRECEDING_RANGE) {
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar32 = DBConfig::ResolveOrder(this_03,pvVar42->type);
    pcVar52 = "U\x04+";
    if (OVar32 == ASCENDING) {
      pcVar52 = "U\x04-";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    psVar3 = &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_string_length;
    pcVar18 = "U\x04+";
    if (OVar32 == ASCENDING) {
      pcVar18 = "U\x04-";
    }
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)psVar3;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,pcVar52 + 2,pcVar18 + 3);
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)local_588,pCVar10,(string *)&bound_function,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)_local_568,&pvVar42->expression);
    sVar30 = error_aggr.raw_message._M_string_length;
    _Var29 = error_aggr.raw_message._M_dataplus;
    uVar27 = local_588._0_8_;
    error_aggr.initialized = (bool)local_588[0];
    error_aggr.type = local_588[1];
    error_aggr.raw_message._M_dataplus._M_p = (pointer)local_588._8_8_;
    error_aggr.raw_message._M_string_length = (size_type)local_578._M_pi;
    local_588._8_8_ = _Var29._M_p;
    local_578._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar30;
    local_588._0_8_ = uVar27;
    LogicalType::~LogicalType((LogicalType *)local_588);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)psVar3) goto LAB_00d848f5;
  }
  else {
    OVar32 = INVALID;
  }
  LogicalType::LogicalType((LogicalType *)local_588,BIGINT);
  if (window->end == EXPR_FOLLOWING_RANGE) {
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar32 = DBConfig::ResolveOrder(this_03,pvVar42->type);
    pcVar52 = "U\x04-";
    if (OVar32 == ASCENDING) {
      pcVar52 = "U\x04+";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    psVar3 = &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_string_length;
    pcVar18 = "U\x04-";
    if (OVar32 == ASCENDING) {
      pcVar18 = "U\x04+";
    }
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)psVar3;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,pcVar52 + 2,pcVar18 + 3);
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&function_binder,pCVar10,(string *)&bound_function,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)local_560._M_pi,&pvVar42->expression);
    _Var28._M_pi = local_578._M_pi;
    uVar27 = local_588._8_8_;
    local_588._0_2_ = function_binder.binder.ptr._0_2_;
    local_588._8_8_ = function_binder.context;
    local_578._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_598._M_p;
    function_binder.context = (ClientContext *)uVar27;
    _Stack_598._M_p = (pointer)_Var28._M_pi;
    LogicalType::~LogicalType((LogicalType *)&function_binder);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)psVar3) {
LAB_00d84aaa:
      operator_delete(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function);
    }
  }
  else if (window->end == EXPR_PRECEDING_RANGE) {
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar32 = DBConfig::ResolveOrder(this_03,pvVar42->type);
    pcVar52 = "U\x04+";
    if (OVar32 == ASCENDING) {
      pcVar52 = "U\x04-";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    psVar3 = &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_string_length;
    pcVar18 = "U\x04+";
    if (OVar32 == ASCENDING) {
      pcVar18 = "U\x04-";
    }
    bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)psVar3;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bound_function,pcVar52 + 2,pcVar18 + 3);
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&function_binder,pCVar10,(string *)&bound_function,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)local_560._M_pi,&pvVar42->expression);
    _Var28._M_pi = local_578._M_pi;
    uVar27 = local_588._8_8_;
    local_588._0_2_ = function_binder.binder.ptr._0_2_;
    local_588._8_8_ = function_binder.context;
    local_578._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_598._M_p;
    function_binder.context = (ClientContext *)uVar27;
    _Stack_598._M_p = (pointer)_Var28._M_pi;
    LogicalType::~LogicalType((LogicalType *)&function_binder);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)psVar3) goto LAB_00d84aaa;
  }
  if (OVar32 != INVALID) {
    pvVar42 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    pPVar36 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pvVar42->expression);
    puVar37 = BoundExpression::GetExpression(pPVar36);
    pEVar38 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar37);
    LogicalType::LogicalType((LogicalType *)&bound_function,&pEVar38->return_type);
    if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
        *(__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          *)_local_568 !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&function_binder,(this->super_ExpressionBinder).context,
                 (LogicalType *)&bound_function,(LogicalType *)&error_aggr);
      sVar30 = bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_string_length;
      _Var29 = bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_dataplus;
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           CONCAT62(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function._2_6_,function_binder.binder.ptr._0_2_);
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus.
      _M_p = (pointer)function_binder.context;
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
      _M_string_length = (size_type)_Stack_598._M_p;
      function_binder.context = (ClientContext *)_Var29._M_p;
      _Stack_598._M_p = (pointer)sVar30;
      LogicalType::~LogicalType((LogicalType *)&function_binder);
    }
    if ((((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
         &(local_560._M_pi)->_vptr__Sp_counted_base)->_M_t).
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&function_binder,(this->super_ExpressionBinder).context,
                 (LogicalType *)&bound_function,(LogicalType *)local_588);
      _Var29 = bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_dataplus;
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           CONCAT62(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function._2_6_,function_binder.binder.ptr._0_2_);
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus.
      _M_p = (pointer)function_binder.context;
      bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
      _M_string_length = (size_type)_Stack_598._M_p;
      function_binder.context = (ClientContext *)_Var29._M_p;
      LogicalType::~LogicalType((LogicalType *)&function_binder);
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    local_508._M_head_impl =
         (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&function_binder,pCVar10,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_508,(LogicalType *)&bound_function,false);
    oVar25 = function_binder.binder;
    function_binder.binder.ptr = (Binder *)0x0;
    _Var12._M_head_impl =
         (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar37->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)oVar25.ptr;
    if (_Var12._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
    }
    if (function_binder.binder.ptr != (Binder *)0x0) {
      (*(code *)((((function_binder.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                  __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    function_binder.binder.ptr = (Binder *)0x0;
    if (local_508._M_head_impl != (Expression *)0x0) {
      (*((local_508._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_508._M_head_impl = (Expression *)0x0;
    local_588._0_2_ =
         bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function.
         _0_2_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_588 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
               &bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name);
    uVar27 = local_588._0_8_;
    error_aggr.initialized = (bool)local_588[0];
    error_aggr.type = local_588[1];
    local_588._0_8_ = uVar27;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&error_aggr.raw_message,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_588 + 8));
    LogicalType::~LogicalType((LogicalType *)&bound_function);
  }
  pOVar50 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar11 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pOVar50 != pOVar11) {
    do {
      OVar32 = DBConfig::ResolveOrder(this_03,pOVar50->type);
      function_binder.binder.ptr._0_1_ = OVar32;
      null_order = DBConfig::ResolveNullOrder(this_03,OVar32,pOVar50->null_order);
      GetExpression((duckdb *)&bound_function,&pOVar50->expression);
      pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&best_function);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar41->orders,(OrderType *)&function_binder,&null_order,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &bound_function);
      if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
          != (_func_int **)0x0) {
        (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      pOVar50 = pOVar50 + 1;
    } while (pOVar50 != pOVar11);
  }
  pOVar50 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar11 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pOVar50 != pOVar11) {
    do {
      OVar32 = DBConfig::ResolveOrder(this_03,pOVar50->type);
      function_binder.binder.ptr._0_1_ = OVar32;
      null_order = DBConfig::ResolveNullOrder(this_03,OVar32,pOVar50->null_order);
      GetExpression((duckdb *)&bound_function,&pOVar50->expression);
      pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&best_function);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar41->arg_orders,(OrderType *)&function_binder,&null_order,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &bound_function);
      if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
          != (_func_int **)0x0) {
        (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      pOVar50 = pOVar50 + 1;
    } while (pOVar50 != pOVar11);
  }
  LogicalType::LogicalType((LogicalType *)&bound_function,BOOLEAN);
  CastWindowExpression((duckdb *)&function_binder,local_2e0,(LogicalType *)&bound_function);
  expr_01 = local_2e8;
  expr_00 = local_2f0;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  _Var12._M_head_impl =
       (pBVar41->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar41->filter_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)function_binder.binder.ptr;
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::~LogicalType((LogicalType *)&bound_function);
  CastWindowExpression
            ((duckdb *)&bound_function,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)_local_568,(LogicalType *)&error_aggr);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  _Var12._M_head_impl =
       (pBVar41->start_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar41->start_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
  }
  CastWindowExpression
            ((duckdb *)&bound_function,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)local_560._M_pi,(LogicalType *)local_588);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  _Var12._M_head_impl =
       (pBVar41->end_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar41->end_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
  CastWindowExpression((duckdb *)&function_binder,expr_00,(LogicalType *)&bound_function);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  _Var12._M_head_impl =
       (pBVar41->offset_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar41->offset_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)function_binder.binder.ptr;
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::~LogicalType((LogicalType *)&bound_function);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  CastWindowExpression((duckdb *)&bound_function,expr_01,&(pBVar41->super_Expression).return_type);
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  _Var12._M_head_impl =
       (pBVar41->default_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar41->default_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
  }
  WVar6 = window->start;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar41->start = WVar6;
  WVar6 = window->end;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar41->end = WVar6;
  WVar7 = window->exclude_clause;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar41->exclude_clause = WVar7;
  pBVar41 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&best_function);
  pBVar15 = this->node;
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)pBVar15->window_index;
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p
       = (pointer)((long)(pBVar15->windows).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar15->windows).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&function_binder,&name,&(pBVar41->super_Expression).return_type,
             (ColumnBinding *)&bound_function,&depth_local);
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)best_function;
  best_function.index = 0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&this->node->windows,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &bound_function);
  if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)0x0) {
    (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function + 8))();
  }
  local_510._M_head_impl = (Expression *)function_binder.binder.ptr;
  function_binder.binder.ptr = (Binder *)0x0;
  BindResult::BindResult
            (local_518,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_510);
  if ((Binder *)local_510._M_head_impl != (Binder *)0x0) {
    (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                 &((local_510._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->internal).
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  local_510._M_head_impl = (Expression *)0x0;
  if (function_binder.binder.ptr != (Binder *)0x0) {
    (*(code *)((((function_binder.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  LogicalType::~LogicalType((LogicalType *)local_588);
  LogicalType::~LogicalType((LogicalType *)&error_aggr);
  if (best_function.index != 0) {
    (**(code **)(*(long *)best_function.index + 8))();
  }
  if ((pointer)local_540._M_head_impl != (pointer)0x0) {
    (*(local_540._M_head_impl)->_vptr_FunctionData[1])();
  }
  if (local_538._M_head_impl != (AggregateFunction *)0x0) {
    (*((local_538._M_head_impl)->super_BaseScalarFunction).super_SimpleFunction.super_Function.
      _vptr_Function[1])();
  }
  LogicalType::~LogicalType(&local_308);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_558);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&types);
LAB_00d850ff:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&error.extra_info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.final_message._M_dataplus._M_p != &error.final_message.field_2) {
    operator_delete(error.final_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.raw_message._M_dataplus._M_p != &error.raw_message.field_2) {
    operator_delete(error.raw_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  return local_518;
}

Assistant:

BindResult BaseSelectBinder::BindWindow(WindowExpression &window, idx_t depth) {
	QueryErrorContext error_context(window.GetQueryLocation());
	//	Check for macros pretending to be aggregates

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, window.function_name, error_context);
	auto entry = GetCatalogEntry(window.catalog, window.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE && entry &&
	    entry->type == CatalogType::MACRO_ENTRY) {
		auto macro = make_uniq<FunctionExpression>(window.catalog, window.schema, window.function_name,
		                                           std::move(window.children), std::move(window.filter_expr), nullptr,
		                                           window.distinct);
		auto macro_expr = window.Copy();
		return BindMacro(*macro, entry->Cast<ScalarMacroCatalogEntry>(), depth, macro_expr);
	}

	auto name = window.alias;

	if (inside_window) {
		throw BinderException(error_context, "window function calls cannot be nested");
	}
	if (depth > 0) {
		throw BinderException(error_context, "correlated columns in window functions not supported");
	}

	// If we have range expressions, then only one order by clause is allowed.
	const auto is_range =
	    (window.start == WindowBoundary::EXPR_PRECEDING_RANGE || window.start == WindowBoundary::EXPR_FOLLOWING_RANGE ||
	     window.end == WindowBoundary::EXPR_PRECEDING_RANGE || window.end == WindowBoundary::EXPR_FOLLOWING_RANGE);
	if (is_range && window.orders.size() != 1) {
		throw BinderException(error_context, "RANGE frames must have only one ORDER BY expression");
	}
	// bind inside the children of the window function
	// we set the inside_window flag to true to prevent binding nested window functions
	inside_window = true;
	ErrorData error;
	for (auto &child : window.children) {
		BindChild(child, depth, error);
	}
	for (auto &child : window.partitions) {
		BindChild(child, depth, error);
	}
	for (auto &order : window.orders) {
		BindChild(order.expression, depth, error);

		//	If the frame is a RANGE frame and the type is a time,
		//	then we have to convert the time to a timestamp to avoid wrapping.
		if (!is_range || error.HasError()) {
			continue;
		}
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		const auto type_id = bound_order->return_type.id();
		if (type_id == LogicalTypeId::TIME || type_id == LogicalTypeId::TIME_TZ) {
			//	Convert to time + epoch and rebind
			unique_ptr<ParsedExpression> epoch = make_uniq<ConstantExpression>(Value::DATE(date_t::epoch()));
			BindChild(epoch, depth, error);
			BindRangeExpression(context, "+", order.expression, epoch);
		}
	}
	BindChild(window.filter_expr, depth, error);
	BindChild(window.start_expr, depth, error);
	BindChild(window.end_expr, depth, error);
	BindChild(window.offset_expr, depth, error);
	BindChild(window.default_expr, depth, error);

	for (auto &order : window.arg_orders) {
		BindChild(order.expression, depth, error);
	}

	inside_window = false;
	if (error.HasError()) {
		// failed to bind children of window function
		return BindResult(std::move(error));
	}

	//	Restore any collation expressions
	for (auto &order : window.arg_orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	for (auto &part_expr : window.partitions) {
		auto &bound_partition = BoundExpression::GetExpression(*part_expr);
		ExpressionBinder::PushCollation(context, bound_partition, bound_partition->return_type);
	}
	for (auto &order : window.orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	// successfully bound all children: create bound window function
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> children;
	for (auto &child : window.children) {
		D_ASSERT(child.get());
		D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound = BoundExpression::GetExpression(*child);
		// Add casts for positional arguments
		const auto argno = children.size();
		switch (window.GetExpressionType()) {
		case ExpressionType::WINDOW_NTILE:
			// ntile(bigint)
			if (argno == 0) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		case ExpressionType::WINDOW_NTH_VALUE:
			// nth_value(<expr>, index)
			if (argno == 1) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		default:
			break;
		}
		types.push_back(bound->return_type);
		children.push_back(std::move(bound));
	}
	//  Determine the function type.
	LogicalType sql_type;
	unique_ptr<AggregateFunction> aggregate;
	unique_ptr<FunctionData> bind_info;
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE) {
		//  Look up the aggregate function in the catalog
		if (!entry || entry->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			//	Not an aggregate: Look it up to generate error
			Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, window.catalog, window.schema,
			                                                 window.function_name, error_context);
		}
		auto &func = entry->Cast<AggregateFunctionCatalogEntry>();
		D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

		// bind the aggregate
		ErrorData error_aggr;
		FunctionBinder function_binder(context);
		auto best_function = function_binder.BindFunction(func.name, func.functions, types, error_aggr);
		if (!best_function.IsValid()) {
			error_aggr.AddQueryLocation(window);
			error_aggr.Throw();
		}

		// found a matching function! bind it as an aggregate
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto window_bound_aggregate = function_binder.BindAggregateFunction(bound_function, std::move(children));
		// create the aggregate
		aggregate = make_uniq<AggregateFunction>(window_bound_aggregate->function);
		bind_info = std::move(window_bound_aggregate->bind_info);
		children = std::move(window_bound_aggregate->children);
		sql_type = window_bound_aggregate->return_type;

	} else {
		// fetch the child of the non-aggregate window function (if any)
		sql_type = ResolveWindowExpressionType(window.GetExpressionType(), types);
	}
	auto result = make_uniq<BoundWindowExpression>(window.GetExpressionType(), sql_type, std::move(aggregate),
	                                               std::move(bind_info));
	result->children = std::move(children);
	for (auto &child : window.partitions) {
		result->partitions.push_back(GetExpression(child));
	}
	result->ignore_nulls = window.ignore_nulls;
	result->distinct = window.distinct;

	// Convert RANGE boundary expressions to ORDER +/- expressions.
	// Note that PRECEEDING and FOLLOWING refer to the sequential order in the frame,
	// not the natural ordering of the type. This means that the offset arithmetic must be reversed
	// for ORDER BY DESC.
	auto &config = DBConfig::GetConfig(context);
	auto range_sense = OrderType::INVALID;
	LogicalType start_type = LogicalType::BIGINT;
	if (window.start == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);

	} else if (window.start == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);
	}

	LogicalType end_type = LogicalType::BIGINT;
	if (window.end == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);

	} else if (window.end == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);
	}

	// Cast ORDER and boundary expressions to the same type
	if (range_sense != OrderType::INVALID) {
		D_ASSERT(window.orders.size() == 1);

		auto &order_expr = window.orders[0].expression;
		D_ASSERT(order_expr.get());
		D_ASSERT(order_expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		auto order_type = bound_order->return_type;
		if (window.start_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, start_type);
		}
		if (window.end_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, end_type);
		}

		// Cast all three to match
		bound_order = BoundCastExpression::AddCastToType(context, std::move(bound_order), order_type);
		start_type = end_type = order_type;
	}

	for (auto &order : window.orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->orders.emplace_back(type, null_order, std::move(expression));
	}

	// Argument orders are just like arguments, not frames
	for (auto &order : window.arg_orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->arg_orders.emplace_back(type, null_order, std::move(expression));
	}

	result->filter_expr = CastWindowExpression(window.filter_expr, LogicalType::BOOLEAN);
	result->start_expr = CastWindowExpression(window.start_expr, start_type);
	result->end_expr = CastWindowExpression(window.end_expr, end_type);
	result->offset_expr = CastWindowExpression(window.offset_expr, LogicalType::BIGINT);
	result->default_expr = CastWindowExpression(window.default_expr, result->return_type);
	result->start = window.start;
	result->end = window.end;
	result->exclude_clause = window.exclude_clause;

	// create a BoundColumnRef that references this entry
	auto colref = make_uniq<BoundColumnRefExpression>(std::move(name), result->return_type,
	                                                  ColumnBinding(node.window_index, node.windows.size()), depth);
	// move the WINDOW expression into the set of bound windows
	node.windows.push_back(std::move(result));
	return BindResult(std::move(colref));
}